

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k054539.c
# Opt level: O0

void k054539_w(void *chip,UINT16 offset,UINT8 data)

{
  int iVar1;
  undefined1 *puVar2;
  undefined4 uVar3;
  bool bVar4;
  long local_58;
  UINT8 *regptr;
  UINT8 *posptr;
  int pan;
  int offs;
  int ch;
  UINT8 latch;
  k054539_state *info;
  UINT8 data_local;
  UINT16 offset_local;
  void *chip_local;
  
  bVar4 = false;
  if ((*(byte *)((long)chip + 0x8f0) & 4) != 0) {
    bVar4 = (*(byte *)((long)chip + 0xb20) & 1) != 0;
  }
  if ((bVar4) && (offset < 0x100)) {
    iVar1 = (offset & 0x1f) - 0xc;
    if ((-1 < iVar1) && (iVar1 < 3)) {
      *(UINT8 *)((long)chip + (long)iVar1 + (long)((int)(uint)offset >> 5) * 3 + 0x8d8) = data;
      return;
    }
  }
  else if (offset != 0x13f) {
    if (offset == 0x214) {
      if (bVar4) {
        for (pan = 0; pan < 8; pan = pan + 1) {
          if (((uint)data & 1 << ((byte)pan & 0x1f)) != 0) {
            puVar2 = (undefined1 *)((long)chip + (long)pan * 3 + 0x8d8);
            iVar1 = pan << 5;
            *(undefined1 *)((long)chip + (long)iVar1 + 0x8fd) = *puVar2;
            *(undefined1 *)((long)chip + (long)iVar1 + 0x8fe) = puVar2[1];
            *(undefined1 *)((long)chip + (long)iVar1 + 0x8ff) = puVar2[2];
            k054539_keyon((k054539_state *)chip,pan);
          }
        }
      }
      else {
        for (pan = 0; pan < 8; pan = pan + 1) {
          if (((uint)data & 1 << ((byte)pan & 0x1f)) != 0) {
            k054539_keyon((k054539_state *)chip,pan);
          }
        }
      }
    }
    else if (offset == 0x215) {
      for (pan = 0; pan < 8; pan = pan + 1) {
        if (((uint)data & 1 << ((byte)pan & 0x1f)) != 0) {
          k054539_keyoff((k054539_state *)chip,pan);
        }
      }
    }
    else if (offset == 0x227) {
      *(undefined1 *)((long)chip + 0xbe0) = 0;
    }
    else if (offset == 0x22d) {
      if (*(char *)((long)chip + 0xb1f) == -0x80) {
        *(UINT8 *)(*(long *)((long)chip + 0xb40) + (ulong)*(uint *)((long)chip + 0xb34)) = data;
      }
      *(int *)((long)chip + 0xb34) = *(int *)((long)chip + 0xb34) + 1;
      if (*(int *)((long)chip + 0xb34) == *(int *)((long)chip + 0xb38)) {
        *(undefined4 *)((long)chip + 0xb34) = 0;
      }
    }
    else if (offset == 0x22e) {
      if (data == 0x80) {
        local_58 = *(long *)((long)chip + 0xb28);
      }
      else {
        local_58 = *(long *)((long)chip + 0xb48) + (long)(int)((uint)data << 0x11);
      }
      *(long *)((long)chip + 0xb40) = local_58;
      uVar3 = 0x20000;
      if (data == 0x80) {
        uVar3 = 0x4000;
      }
      *(undefined4 *)((long)chip + 0xb38) = uVar3;
      *(undefined4 *)((long)chip + 0xb34) = 0;
    }
    else if ((offset == 0x22f) && ((data & 0x20) == 0)) {
      *(undefined1 *)((long)chip + 0xbe0) = 0;
    }
  }
  *(UINT8 *)((long)chip + (ulong)offset + 0x8f1) = data;
  return;
}

Assistant:

static void k054539_w(void *chip, UINT16 offset, UINT8 data)
{
	k054539_state *info = (k054539_state *)chip;
	UINT8 latch;
	int ch;

	if(0) {
		int voice, reg;

		/* The K054539 has behavior like many other wavetable chips including
		   the Ensoniq 550x and Gravis GF-1: if a voice is active, writing
		   to it's current position is silently ignored.

		   Dadandaan depends on this or the vocals go wrong.
		*/
		if (offset < 8*0x20)
		{
			voice = offset / 0x20;
			reg = offset & ~0x20;

			if(info->regs[0x22c] & (1<<voice))
				if (reg >= 0xc && reg <= 0xe)
					return;
		}
	}

	latch = (info->flags & K054539_UPDATE_AT_KEYON) && (info->regs[0x22f] & 1);

	if (latch && offset < 0x100)
	{
		int offs = (offset & 0x1f) - 0xc;
		ch = offset >> 5;

		if (offs >= 0 && offs <= 2)
		{
			// latch writes to the position index registers
			info->posreg_latch[ch][offs] = data;
			return;
		}
	}

	else
		switch(offset) {
		case 0x13f: {
			int pan = data >= 0x11 && data <= 0x1f ? data - 0x11 : 0x18 - 0x11;
			//if (info->apan_cb != NULL)
			//	info->apan_cb(pantab[pan], pantab[0xe - pan]);
			break;
		}

		case 0x214:
			if (latch)
			{
				for(ch=0; ch<8; ch++)
				{
					if(data & (1<<ch))
					{
						UINT8 *posptr = &info->posreg_latch[ch][0];
						UINT8 *regptr = info->regs + (ch<<5) + 0xc;

						// update the chip at key-on
						regptr[0] = posptr[0];
						regptr[1] = posptr[1];
						regptr[2] = posptr[2];

						k054539_keyon(info, ch);
					}
				}
			}
			else
			{
				for(ch=0; ch<8; ch++)
					if(data & (1<<ch))
						k054539_keyon(info, ch);
			}
		break;

		case 0x215:
			for(ch=0; ch<8; ch++)
				if(data & (1<<ch))
					k054539_keyoff(info, ch);
		break;

		case 0x227:
		{
			//attotime period = attotime::from_hz((float)(38 + data) * (info->clock/384.0f/14400.0f)) / 2.0f;

			//info->timer->adjust(period, 0, period);

			info->timer_state = 0;
			//info->timer_handler(info->timer_state);
		}
		break;

		case 0x22d:
			if(info->regs[0x22e] == 0x80)
				info->cur_zone[info->cur_ptr] = data;
			info->cur_ptr++;
			if(info->cur_ptr == info->cur_limit)
				info->cur_ptr = 0;
		break;

		case 0x22e:
			info->cur_zone =
				data == 0x80 ? info->ram :
				&info->rom[0x20000*data];
			info->cur_limit = data == 0x80 ? 0x4000 : 0x20000;
			info->cur_ptr = 0;
		break;

		case 0x22f:
			if (!(data & 0x20)) // Disable timer output?
			{
				info->timer_state = 0;
				//info->timer_handler(info->timer_state);
			}
		break;

		default:
#if 0
			if(info->regs[offset] != data) {
				if((offset & 0xff00) == 0) {
					chanoff = offset & 0x1f;
					if(chanoff < 4 || chanoff == 5 ||
						(chanoff >=8 && chanoff <= 0xa) ||
						(chanoff >= 0xc && chanoff <= 0xe))
						break;
				}
				if(1 || ((offset >= 0x200) && (offset <= 0x210)))
					break;
				emu_logf(&info->logger, DEVLOG_TRACE, "%03x = %02x\n", offset, data);
			}
#endif
		break;
	}

	info->regs[offset] = data;
}